

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
UnsafeArenaAddAllocated<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *value)

{
  int iVar1;
  string *in_RSI;
  Arena *in_RDI;
  
  if ((*(long *)(in_RDI + 0x10) == 0) || (*(int *)(in_RDI + 8) == *(int *)(in_RDI + 0xc))) {
    Reserve((RepeatedPtrFieldBase *)in_RSI,(int)((ulong)in_RDI >> 0x20));
    **(int **)(in_RDI + 0x10) = **(int **)(in_RDI + 0x10) + 1;
  }
  else if (**(int **)(in_RDI + 0x10) == *(int *)(in_RDI + 0xc)) {
    cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (*(void **)(*(long *)(in_RDI + 0x10) + 8 + (long)*(int *)(in_RDI + 8) * 8));
    StringTypeHandler::Delete(in_RSI,in_RDI);
  }
  else if (*(int *)(in_RDI + 8) < **(int **)(in_RDI + 0x10)) {
    *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8 + (long)**(int **)(in_RDI + 0x10) * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8 + (long)*(int *)(in_RDI + 8) * 8);
    **(int **)(in_RDI + 0x10) = **(int **)(in_RDI + 0x10) + 1;
  }
  else {
    **(int **)(in_RDI + 0x10) = **(int **)(in_RDI + 0x10) + 1;
  }
  iVar1 = *(int *)(in_RDI + 8);
  *(int *)(in_RDI + 8) = iVar1 + 1;
  *(string **)(*(long *)(in_RDI + 0x10) + 8 + (long)iVar1 * 8) = in_RSI;
  return;
}

Assistant:

void RepeatedPtrFieldBase::UnsafeArenaAddAllocated(
    typename TypeHandler::Type* value) {
  // Make room for the new pointer.
  if (!rep_ || current_size_ == total_size_) {
    // The array is completely full with no cleared objects, so grow it.
    Reserve(total_size_ + 1);
    ++rep_->allocated_size;
  } else if (rep_->allocated_size == total_size_) {
    // There is no more space in the pointer array because it contains some
    // cleared objects awaiting reuse.  We don't want to grow the array in this
    // case because otherwise a loop calling AddAllocated() followed by Clear()
    // would leak memory.
    TypeHandler::Delete(cast<TypeHandler>(rep_->elements[current_size_]),
                        arena_);
  } else if (current_size_ < rep_->allocated_size) {
    // We have some cleared objects.  We don't care about their order, so we
    // can just move the first one to the end to make space.
    rep_->elements[rep_->allocated_size] = rep_->elements[current_size_];
    ++rep_->allocated_size;
  } else {
    // There are no cleared objects.
    ++rep_->allocated_size;
  }

  rep_->elements[current_size_++] = value;
}